

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O1

void Mpm_ManStop(Mpm_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  word *pwVar4;
  int *piVar5;
  Vec_Wrd_t *pVVar6;
  Vec_Int_t *pVVar7;
  Hsh_IntMan_t *__ptr;
  Vec_Wec_t *__ptr_00;
  void *pvVar8;
  Vec_Ptr_t *__ptr_01;
  Mmr_Step_t *__ptr_02;
  void **__ptr_03;
  bool bVar9;
  FILE *__stream;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  if ((p->pPars->fUseTruth != 0) && (p->pPars->fVeryVerbose != 0)) {
    __stream = fopen("truths.txt","wb");
    pVVar3 = p->vTtMem;
    if (_stdout == __stream) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar3->nEntries);
    }
    if (0 < pVVar3->nEntries) {
      uVar11 = 0;
      do {
        pwVar4 = pVVar3->ppPages[uVar11 >> ((byte)pVVar3->LogPageSze & 0x1f)];
        if (pwVar4 == (word *)0x0) break;
        uVar1 = pVVar3->nEntrySize;
        if (0 < (int)uVar1) {
          uVar2 = pVVar3->PageMask;
          uVar12 = (ulong)uVar1;
          do {
            lVar13 = 0x3c;
            do {
              uVar10 = (uint)(pwVar4[(long)(int)((uVar2 & uVar11) * uVar1) + (uVar12 - 1)] >>
                             ((byte)lVar13 & 0x3f)) & 0xf;
              if (uVar10 < 10) {
                fprintf(__stream,"%d");
              }
              else {
                fputc(uVar10 + 0x37,__stream);
              }
              lVar13 = lVar13 + -4;
            } while (lVar13 != -4);
            bVar9 = 1 < (long)uVar12;
            uVar12 = uVar12 - 1;
          } while (bVar9);
        }
        fputc(10,__stream);
        uVar11 = uVar11 + 1;
      } while ((int)uVar11 < pVVar3->nEntries);
    }
    fclose(__stream);
    uVar11 = p->vTtMem->nEntries;
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)(int)uVar11 * ((double)p->nTruWords * 16.0 + 1.0) * 9.5367431640625e-07,
           (ulong)uVar11,(ulong)(uint)p->nLutSize,"truths.txt");
  }
  if ((p->pPars->fUseDsd != 0) && (p->pPars->fVerbose != 0)) {
    Mpm_ManPrintDsdStats(p);
  }
  pVVar3 = p->vTtMem;
  if (pVVar3 != (Vec_Mem_t *)0x0) {
    if (pVVar3->vTable != (Vec_Int_t *)0x0) {
      piVar5 = pVVar3->vTable->pArray;
      if (piVar5 != (int *)0x0) {
        free(piVar5);
        pVVar3->vTable->pArray = (int *)0x0;
      }
      if (pVVar3->vTable != (Vec_Int_t *)0x0) {
        free(pVVar3->vTable);
        pVVar3->vTable = (Vec_Int_t *)0x0;
      }
    }
    if (pVVar3->vNexts != (Vec_Int_t *)0x0) {
      piVar5 = pVVar3->vNexts->pArray;
      if (piVar5 != (int *)0x0) {
        free(piVar5);
        pVVar3->vNexts->pArray = (int *)0x0;
      }
      if (pVVar3->vNexts != (Vec_Int_t *)0x0) {
        free(pVVar3->vNexts);
        pVVar3->vNexts = (Vec_Int_t *)0x0;
      }
    }
    pVVar3 = p->vTtMem;
    if (-1 < pVVar3->iPage) {
      lVar13 = -1;
      do {
        if (pVVar3->ppPages[lVar13 + 1] != (word *)0x0) {
          free(pVVar3->ppPages[lVar13 + 1]);
          pVVar3->ppPages[lVar13 + 1] = (word *)0x0;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar3->iPage);
    }
    if (pVVar3->ppPages != (word **)0x0) {
      free(pVVar3->ppPages);
      pVVar3->ppPages = (word **)0x0;
    }
    if (pVVar3 != (Vec_Mem_t *)0x0) {
      free(pVVar3);
    }
  }
  if (p->pHash != (Hsh_IntMan_t *)0x0) {
    pVVar6 = p->vPerm6;
    if (pVVar6->pArray != (word *)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (word *)0x0;
    }
    if (pVVar6 != (Vec_Wrd_t *)0x0) {
      free(pVVar6);
    }
    pVVar7 = p->vMap2Perm;
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    if (pVVar7 != (Vec_Int_t *)0x0) {
      free(pVVar7);
    }
    pVVar7 = p->vConfgRes;
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    if (pVVar7 != (Vec_Int_t *)0x0) {
      free(pVVar7);
    }
    pVVar7 = p->pHash->vData;
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    if (pVVar7 != (Vec_Int_t *)0x0) {
      free(pVVar7);
    }
    __ptr = p->pHash;
    pVVar7 = __ptr->vTable;
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    if (pVVar7 != (Vec_Int_t *)0x0) {
      free(pVVar7);
    }
    pVVar6 = __ptr->vObjs;
    if (pVVar6->pArray != (word *)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (word *)0x0;
    }
    if (pVVar6 != (Vec_Wrd_t *)0x0) {
      free(pVVar6);
    }
    if (__ptr != (Hsh_IntMan_t *)0x0) {
      free(__ptr);
    }
  }
  __ptr_00 = p->vNpnConfigs;
  if (__ptr_00 != (Vec_Wec_t *)0x0) {
    if (0 < __ptr_00->nCap) {
      lVar13 = 8;
      lVar15 = 0;
      do {
        pvVar8 = *(void **)((long)&__ptr_00->pArray->nCap + lVar13);
        if (pvVar8 != (void *)0x0) {
          free(pvVar8);
          *(undefined8 *)((long)&__ptr_00->pArray->nCap + lVar13) = 0;
        }
        lVar15 = lVar15 + 1;
        lVar13 = lVar13 + 0x10;
      } while (lVar15 < __ptr_00->nCap);
    }
    if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (Vec_Int_t *)0x0;
    }
    __ptr_00->nCap = 0;
    __ptr_00->nSize = 0;
    free(__ptr_00);
    p->vNpnConfigs = (Vec_Wec_t *)0x0;
  }
  __ptr_01 = p->vTemp;
  if (__ptr_01->pArray != (void **)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (void **)0x0;
  }
  if (__ptr_01 != (Vec_Ptr_t *)0x0) {
    free(__ptr_01);
  }
  __ptr_02 = p->pManCuts;
  if (-1 < __ptr_02->uMask) {
    lVar13 = 0;
    do {
      lVar15 = lVar13 * 0x38;
      if (0 < *(int *)((long)__ptr_02 + lVar15 + 0x34)) {
        lVar14 = 0;
        do {
          pvVar8 = *(void **)(*(long *)((long)__ptr_02 + lVar15 + 0x38) + lVar14 * 8);
          if (pvVar8 != (void *)0x0) {
            free(pvVar8);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)((long)__ptr_02 + lVar15 + 0x34));
      }
      pvVar8 = *(void **)((long)__ptr_02 + lVar15 + 0x38);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        *(undefined8 *)((long)__ptr_02 + lVar15 + 0x38) = 0;
      }
      pvVar8 = *(void **)((long)__ptr_02 + lVar15 + 0x48);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        *(undefined8 *)((long)__ptr_02 + lVar15 + 0x48) = 0;
      }
      bVar9 = lVar13 < __ptr_02->uMask;
      lVar13 = lVar13 + 1;
    } while (bVar9);
  }
  if (__ptr_02 != (Mmr_Step_t *)0x0) {
    free(__ptr_02);
  }
  __ptr_03 = (p->vFreeUnits).pArray;
  if (__ptr_03 != (void **)0x0) {
    free(__ptr_03);
    (p->vFreeUnits).pArray = (void **)0x0;
  }
  piVar5 = (p->vCutBests).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p->vCutBests).pArray = (int *)0x0;
  }
  piVar5 = (p->vCutLists).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p->vCutLists).pArray = (int *)0x0;
  }
  piVar5 = (p->vMigRefs).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p->vMigRefs).pArray = (int *)0x0;
  }
  piVar5 = (p->vMapRefs).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p->vMapRefs).pArray = (int *)0x0;
  }
  piVar5 = (p->vEstRefs).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p->vEstRefs).pArray = (int *)0x0;
  }
  piVar5 = (p->vRequireds).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p->vRequireds).pArray = (int *)0x0;
  }
  piVar5 = (p->vTimes).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p->vTimes).pArray = (int *)0x0;
  }
  piVar5 = (p->vAreas).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p->vAreas).pArray = (int *)0x0;
  }
  piVar5 = (p->vEdges).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p->vEdges).pArray = (int *)0x0;
  }
  if (p != (Mpm_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Mpm_ManStop( Mpm_Man_t * p )
{
    if ( p->pPars->fUseTruth && p->pPars->fVeryVerbose )
    {
        char * pFileName = "truths.txt";
        FILE * pFile = fopen( pFileName, "wb" );
        Vec_MemDump( pFile, p->vTtMem );
        fclose( pFile );
        printf( "Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n", 
            Vec_MemEntryNum(p->vTtMem), p->nLutSize, pFileName,
            (16.0 * p->nTruWords + 1.0) * Vec_MemEntryNum(p->vTtMem) / (1 << 20) );
    }
    if ( p->pPars->fUseDsd && p->pPars->fVerbose )
        Mpm_ManPrintDsdStats( p );
    if ( p->vTtMem ) 
    {
        Vec_MemHashFree( p->vTtMem );
        Vec_MemFree( p->vTtMem );
    }
    if ( p->pHash )
    {
        Vec_WrdFree( p->vPerm6 );
        Vec_IntFree( p->vMap2Perm );
        Vec_IntFree( p->vConfgRes );
        Vec_IntFree( p->pHash->vData );
        Hsh_IntManStop( p->pHash );
    }
    Vec_WecFreeP( &p->vNpnConfigs );
    Vec_PtrFree( p->vTemp );
    Mmr_StepStop( p->pManCuts );
    ABC_FREE( p->vFreeUnits.pArray );
    // mapping attributes
    ABC_FREE( p->vCutBests.pArray );
    ABC_FREE( p->vCutLists.pArray );
    ABC_FREE( p->vMigRefs.pArray );
    ABC_FREE( p->vMapRefs.pArray );
    ABC_FREE( p->vEstRefs.pArray );
    ABC_FREE( p->vRequireds.pArray );
    ABC_FREE( p->vTimes.pArray );
    ABC_FREE( p->vAreas.pArray );
    ABC_FREE( p->vEdges.pArray );
    ABC_FREE( p );
}